

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::
FunctionMocker<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
::PerformDefaultAction
          (FunctionMocker<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           *this,ArgumentTuple *args,string *call_description)

{
  Result RVar1;
  OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_00;
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_01;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  ArgumentTuple local_28;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 ==
      (OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
       *)0x0) {
    std::operator+(&bStack_48,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    RVar1 = DefaultValue<bool>::Get();
    std::__cxx11::string::~string((string *)&bStack_48);
  }
  else {
    this_01 = OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
              ::GetAction(this_00);
    local_28.
    super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .
    super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .
    super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         = (args->
           super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
           ).
           super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
           .
           super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    ;
    local_28.
    super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .
    super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (args->
         super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         ).
         super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
    local_28.
    super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (args->
         super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
         ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    RVar1 = Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::Perform(this_01,&local_28);
  }
  return RVar1;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }